

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O1

void __thiscall DSDcc::DSDDstar::DStarHeader::setRpt2(DStarHeader *this,char *rpt2,bool fromHD)

{
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28;
  
  if ((byte)(this->m_rpt2FromHD ^ 1U | fromHD) == 1) {
    local_40 = &local_30;
    if (rpt2 == (char *)0x0) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_30 = *(undefined8 *)rpt2;
    local_38 = 8;
    local_28 = 0;
    std::__cxx11::string::operator=((string *)&this->m_rpt2,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40);
    }
    this->m_rpt2FromHD = fromHD;
  }
  return;
}

Assistant:

void setRpt2(const char *rpt2, bool fromHD)
       {
           if (!m_rpt2FromHD || fromHD)
           {
               m_rpt2 = std::string(rpt2, 8);
               m_rpt2FromHD = fromHD;
           }
       }